

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachFilter(sqlite3_vtab_cursor *cur,int idxNum,char *idxStr,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  undefined4 uVar4;
  char *local_70;
  char *zErr;
  JsonNode *pNode;
  long lStack_58;
  int rc;
  sqlite3_int64 n;
  char *zRoot;
  char *z;
  JsonEachCursor *p;
  sqlite3_value **argv_local;
  char *pcStack_28;
  int argc_local;
  char *idxStr_local;
  sqlite3_vtab_cursor *psStack_18;
  int idxNum_local;
  sqlite3_vtab_cursor *cur_local;
  
  n = 0;
  z = (char *)cur;
  p = (JsonEachCursor *)argv;
  argv_local._4_4_ = argc;
  pcStack_28 = idxStr;
  idxStr_local._4_4_ = idxNum;
  psStack_18 = cur;
  jsonEachCursorReset((JsonEachCursor *)cur);
  if (idxStr_local._4_4_ == 0) {
    cur_local._4_4_ = 0;
  }
  else {
    zRoot = (char *)sqlite3_value_text((sqlite3_value *)(p->base).pVtab);
    if ((uchar *)zRoot == (uchar *)0x0) {
      cur_local._4_4_ = 0;
    }
    else {
      iVar1 = sqlite3_value_bytes((sqlite3_value *)(p->base).pVtab);
      lStack_58 = (long)iVar1;
      pvVar2 = sqlite3_malloc64(lStack_58 + 1);
      *(void **)(z + 0x20) = pvVar2;
      if (*(long *)(z + 0x20) == 0) {
        cur_local._4_4_ = 7;
      }
      else {
        memcpy(*(void **)(z + 0x20),zRoot,lStack_58 + 1);
        iVar1 = jsonParse((JsonParse *)(z + 0x30),(sqlite3_context *)0x0,*(char **)(z + 0x20));
        if (iVar1 == 0) {
          if ((z[0x19] == '\0') ||
             (iVar1 = jsonParseFindParents((JsonParse *)(z + 0x30)), iVar1 == 0)) {
            zErr = (char *)0x0;
            if (idxStr_local._4_4_ == 3) {
              local_70 = (char *)0x0;
              n = (sqlite3_int64)sqlite3_value_text(*(sqlite3_value **)&p->iRowid);
              if ((uchar *)n == (uchar *)0x0) {
                return 0;
              }
              iVar1 = sqlite3_value_bytes(*(sqlite3_value **)&p->iRowid);
              lStack_58 = (long)iVar1;
              pvVar2 = sqlite3_malloc64(lStack_58 + 1);
              *(void **)(z + 0x28) = pvVar2;
              if (*(long *)(z + 0x28) == 0) {
                return 7;
              }
              memcpy(*(void **)(z + 0x28),(void *)n,lStack_58 + 1);
              if (*(char *)n == '$') {
                zErr = (char *)jsonLookupStep((JsonParse *)(z + 0x30),0,
                                              (char *)(*(long *)(z + 0x28) + 1),(int *)0x0,&local_70
                                             );
              }
              else {
                local_70 = (char *)n;
              }
              if (local_70 != (char *)0x0) {
                sqlite3_free(psStack_18->pVtab->zErrMsg);
                pcVar3 = jsonPathSyntaxError(local_70);
                psStack_18->pVtab->zErrMsg = pcVar3;
                jsonEachCursorReset((JsonEachCursor *)z);
                if (psStack_18->pVtab->zErrMsg == (char *)0x0) {
                  return 7;
                }
                return 1;
              }
              if (zErr == (char *)0x0) {
                return 0;
              }
            }
            else {
              zErr = *(char **)(z + 0x38);
            }
            uVar4 = (undefined4)((long)zErr - *(long *)(z + 0x38) >> 4);
            *(undefined4 *)(z + 0x10) = uVar4;
            *(undefined4 *)(z + 0xc) = uVar4;
            z[0x18] = *zErr;
            if ((byte)z[0x18] < 6) {
              *(int *)(z + 0x14) = *(int *)(z + 0x10) + 1;
            }
            else {
              zErr[8] = '\0';
              zErr[9] = '\0';
              zErr[10] = '\0';
              zErr[0xb] = '\0';
              *(int *)(z + 0x14) = *(int *)(z + 0x10) + *(int *)(zErr + 4) + 1;
              if (z[0x19] == '\0') {
                *(int *)(z + 0x10) = *(int *)(z + 0x10) + 1;
              }
              else {
                z[0x18] = *(char *)(*(long *)(z + 0x38) +
                                   (ulong)*(uint *)(*(long *)(z + 0x48) +
                                                   (ulong)*(uint *)(z + 0x10) * 4) * 0x10);
                if ((*(int *)(z + 0x10) != 0) &&
                   ((*(byte *)(*(long *)(z + 0x38) + (ulong)(*(int *)(z + 0x10) - 1) * 0x10 + 1) &
                    0x40) != 0)) {
                  *(int *)(z + 0x10) = *(int *)(z + 0x10) + -1;
                }
              }
            }
            cur_local._4_4_ = 0;
          }
          else {
            jsonEachCursorReset((JsonEachCursor *)z);
            cur_local._4_4_ = 7;
          }
        }
        else {
          pNode._4_4_ = 7;
          if (z[0x50] == '\0') {
            sqlite3_free(psStack_18->pVtab->zErrMsg);
            pcVar3 = sqlite3_mprintf("malformed JSON");
            psStack_18->pVtab->zErrMsg = pcVar3;
            if (psStack_18->pVtab->zErrMsg != (char *)0x0) {
              pNode._4_4_ = 1;
            }
          }
          jsonEachCursorReset((JsonEachCursor *)z);
          cur_local._4_4_ = pNode._4_4_;
        }
      }
    }
  }
  return cur_local._4_4_;
}

Assistant:

static int jsonEachFilter(
  sqlite3_vtab_cursor *cur,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  const char *z;
  const char *zRoot = 0;
  sqlite3_int64 n;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(argc);
  jsonEachCursorReset(p);
  if( idxNum==0 ) return SQLITE_OK;
  z = (const char*)sqlite3_value_text(argv[0]);
  if( z==0 ) return SQLITE_OK;
  n = sqlite3_value_bytes(argv[0]);
  p->zJson = sqlite3_malloc64( n+1 );
  if( p->zJson==0 ) return SQLITE_NOMEM;
  memcpy(p->zJson, z, (size_t)n+1);
  if( jsonParse(&p->sParse, 0, p->zJson) ){
    int rc = SQLITE_NOMEM;
    if( p->sParse.oom==0 ){
      sqlite3_free(cur->pVtab->zErrMsg);
      cur->pVtab->zErrMsg = sqlite3_mprintf("malformed JSON");
      if( cur->pVtab->zErrMsg ) rc = SQLITE_ERROR;
    }
    jsonEachCursorReset(p);
    return rc;
  }else if( p->bRecursive && jsonParseFindParents(&p->sParse) ){
    jsonEachCursorReset(p);
    return SQLITE_NOMEM;
  }else{
    JsonNode *pNode = 0;
    if( idxNum==3 ){
      const char *zErr = 0;
      zRoot = (const char*)sqlite3_value_text(argv[1]);
      if( zRoot==0 ) return SQLITE_OK;
      n = sqlite3_value_bytes(argv[1]);
      p->zRoot = sqlite3_malloc64( n+1 );
      if( p->zRoot==0 ) return SQLITE_NOMEM;
      memcpy(p->zRoot, zRoot, (size_t)n+1);
      if( zRoot[0]!='$' ){
        zErr = zRoot;
      }else{
        pNode = jsonLookupStep(&p->sParse, 0, p->zRoot+1, 0, &zErr);
      }
      if( zErr ){
        sqlite3_free(cur->pVtab->zErrMsg);
        cur->pVtab->zErrMsg = jsonPathSyntaxError(zErr);
        jsonEachCursorReset(p);
        return cur->pVtab->zErrMsg ? SQLITE_ERROR : SQLITE_NOMEM;
      }else if( pNode==0 ){
        return SQLITE_OK;
      }
    }else{
      pNode = p->sParse.aNode;
    }
    p->iBegin = p->i = (int)(pNode - p->sParse.aNode);
    p->eType = pNode->eType;
    if( p->eType>=JSON_ARRAY ){
      assert( pNode->eU==0 );
      VVA( pNode->eU = 3 );
      pNode->u.iKey = 0;
      p->iEnd = p->i + pNode->n + 1;
      if( p->bRecursive ){
        p->eType = p->sParse.aNode[p->sParse.aUp[p->i]].eType;
        if( p->i>0 && (p->sParse.aNode[p->i-1].jnFlags & JNODE_LABEL)!=0 ){
          p->i--;
        }
      }else{
        p->i++;
      }
    }else{
      p->iEnd = p->i+1;
    }
  }
  return SQLITE_OK;
}